

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void __thiscall
kj::_::Delimited<kj::ArrayPtr<const_unsigned_long>_>::ensureStringifiedInitialized
          (Delimited<kj::ArrayPtr<const_unsigned_long>_> *this)

{
  size_t sVar1;
  anon_class_1_0_00000001 local_31;
  Mapper<kj::ArrayPtr<const_unsigned_long>_&> local_30;
  Array<kj::CappedArray<char,_26UL>_> local_28;
  Delimited<kj::ArrayPtr<const_unsigned_long>_> *local_10;
  Delimited<kj::ArrayPtr<const_unsigned_long>_> *this_local;
  
  local_10 = this;
  sVar1 = ArrayPtr<const_unsigned_long>::size(&this->array);
  if (sVar1 != 0) {
    sVar1 = Array<kj::CappedArray<char,_26UL>_>::size(&this->stringified);
    if (sVar1 == 0) {
      Mapper<kj::ArrayPtr<const_unsigned_long>_&>::Mapper(&local_30,&this->array);
      Mapper<kj::ArrayPtr<const_unsigned_long>_&>::
      operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_string_h:886:21)>
                (&local_28,&local_30,&local_31);
      Array<kj::CappedArray<char,_26UL>_>::operator=(&this->stringified,&local_28);
      Array<kj::CappedArray<char,_26UL>_>::~Array(&local_28);
    }
  }
  return;
}

Assistant:

void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }